

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::erase
          (Data<QHashPrivate::Node<QString,_QConfFile_*>_> *this,Bucket bucket)

{
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pSVar1;
  ulong uVar2;
  size_t seed;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pSVar7;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pSVar8;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *fromSpan;
  size_t fromIndex;
  size_t to;
  Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *this_00;
  QStringView key;
  
  Span<QHashPrivate::Node<QString,_QConfFile_*>_>::erase
            ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)bucket.span,bucket.index);
  *(long *)(this + 8) = *(long *)(this + 8) + -1;
  to = bucket.index;
  this_00 = bucket.span;
LAB_00433215:
  pSVar1 = *(Span<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> **)(this + 0x20);
  uVar2 = *(ulong *)(this + 0x10);
  seed = *(size_t *)(this + 0x18);
  uVar3 = uVar2 >> 7;
  fromSpan = this_00;
  fromIndex = to;
  do {
    do {
      fromIndex = fromIndex + 1;
      if (fromIndex == 0x80) {
        fromSpan = fromSpan + 1;
        if (((long)fromSpan - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - uVar3 == 0) {
          fromSpan = pSVar1;
        }
        fromIndex = 0;
      }
      if (fromSpan->offsets[fromIndex] == 0xff) {
        return;
      }
      lVar4 = (ulong)fromSpan->offsets[fromIndex] * 0x20;
      key.m_data = *(storage_type_conflict **)((fromSpan->entries->storage).data + lVar4 + 8);
      key.m_size = *(qsizetype *)((fromSpan->entries->storage).data + lVar4 + 0x10);
      sVar5 = ::qHash(key,seed);
      uVar6 = sVar5 & uVar2 - 1;
      pSVar7 = pSVar1 + (uVar6 >> 7);
      uVar6 = (ulong)((uint)uVar6 & 0x7f);
    } while (uVar6 == fromIndex && pSVar7 == fromSpan);
    do {
      if ((pSVar7 == this_00) && (uVar6 == to)) {
        if (fromSpan == this_00) {
          this_00->offsets[to] = this_00->offsets[fromIndex];
          this_00->offsets[fromIndex] = 0xff;
          to = fromIndex;
          this_00 = fromSpan;
        }
        else {
          Span<QHashPrivate::Node<QString,_QConfFile_*>_>::moveFromSpan
                    ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)this_00,fromSpan,fromIndex,
                     to);
          to = fromIndex;
          this_00 = fromSpan;
        }
        goto LAB_00433215;
      }
      uVar6 = uVar6 + 1;
      if (uVar6 == 0x80) {
        pSVar8 = pSVar7 + 1;
        pSVar7 = pSVar1;
        if (((long)pSVar8 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - uVar3 != 0) {
          pSVar7 = pSVar8;
        }
        uVar6 = 0;
      }
    } while ((pSVar7 != fromSpan) || (uVar6 != fromIndex));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }